

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getaddrinfo.c
# Opt level: O1

void uv__getaddrinfo_done(uv__work *w,int status)

{
  uv_loop_s *__ptr;
  
  if ((long)w[-1].wq[1] + 0x20 == *(long *)((long)w[-1].wq[1] + 0x20)) {
    __assert_fail("uv__has_active_reqs(req->loop)","src/unix/getaddrinfo.c",0x2d,
                  "void uv__getaddrinfo_done(struct uv__work *, int)");
  }
  *(uv_loop_s **)w[-1].wq[0] = w[-1].loop;
  *(void **)&(w[-1].loop)->active_handles = w[-1].wq[0];
  __ptr = (uv_loop_s *)w[1].done;
  w[1].wq[1] = (void *)0x0;
  if (((__ptr == (uv_loop_s *)0x0) && (__ptr = (uv_loop_s *)w[1].wq[0], __ptr == (uv_loop_s *)0x0))
     && (__ptr = w[1].loop, __ptr == (uv_loop_s *)0x0)) {
    __assert_fail("0","src/unix/getaddrinfo.c",0x3a,
                  "void uv__getaddrinfo_done(struct uv__work *, int)");
  }
  free(__ptr);
  w[1].done = (_func_void_uv__work_ptr_int *)0x0;
  w[1].loop = (uv_loop_s *)0x0;
  w[1].wq[0] = (void *)0x0;
  if (status == -0x7d) {
    if (*(int *)&w[2].work != 0) {
      __assert_fail("req->retcode == 0","src/unix/getaddrinfo.c",0x41,
                    "void uv__getaddrinfo_done(struct uv__work *, int)");
    }
    *(undefined4 *)&w[2].work = 0xfffff445;
  }
  (*w[1].work)(w + -1);
  return;
}

Assistant:

static void uv__getaddrinfo_done(struct uv__work* w, int status) {
  uv_getaddrinfo_t* req;
  struct addrinfo *res;

  req = container_of(w, uv_getaddrinfo_t, work_req);
  uv__req_unregister(req->loop, req);

  res = req->res;
  req->res = NULL;

  /* See initialization in uv_getaddrinfo(). */
  if (req->hints)
    free(req->hints);
  else if (req->service)
    free(req->service);
  else if (req->hostname)
    free(req->hostname);
  else
    assert(0);

  req->hints = NULL;
  req->service = NULL;
  req->hostname = NULL;

  if (status == -ECANCELED) {
    assert(req->retcode == 0);
    req->retcode = UV_EAI_CANCELED;
  }

  req->cb(req, req->retcode, res);
}